

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmPolicies.cxx
# Opt level: O2

bool __thiscall cmPolicies::PolicyMap::IsDefined(PolicyMap *this,PolicyID id)

{
  int iVar1;
  
  iVar1 = id * 3;
  if ((((this->Status).super__Base_bitset<4UL>._M_w[(ulong)(long)iVar1 >> 6] >>
        ((long)iVar1 & 0x3fU) & 1) == 0) &&
     (((this->Status).super__Base_bitset<4UL>._M_w[(ulong)(long)(iVar1 + 1) >> 6] >>
       ((long)(iVar1 + 1) & 0x3fU) & 1) == 0)) {
    return ((this->Status).super__Base_bitset<4UL>._M_w[(ulong)(long)(iVar1 + 2) >> 6] >>
            ((long)(iVar1 + 2) & 0x3fU) & 1) != 0;
  }
  return true;
}

Assistant:

bool cmPolicies::PolicyMap::IsDefined(cmPolicies::PolicyID id) const
{
  return this->Status[(POLICY_STATUS_COUNT * id) + OLD] ||
    this->Status[(POLICY_STATUS_COUNT * id) + WARN] ||
    this->Status[(POLICY_STATUS_COUNT * id) + NEW];
}